

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Path>
          (AsciiParser *this,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  undefined8 in_RAX;
  byte unaff_BPL;
  pointer this_00;
  char c;
  char local_31;
  
  local_31 = (char)((ulong)in_RAX >> 0x38);
  bVar3 = SkipWhitespace(this);
  if (((bVar3) && (bVar3 = Expect(this,'['), bVar3)) &&
     (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
    bVar3 = Char1(this,&local_31);
    if (bVar3) {
      if (local_31 == ']') {
        pPVar1 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar2 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        unaff_BPL = 1;
        this_00 = pPVar1;
        if (pPVar2 != pPVar1) {
          do {
            Path::~Path(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pPVar2);
          (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
          super__Vector_impl_data._M_finish = pPVar1;
        }
        goto LAB_003f81a8;
      }
      Rewind(this,1);
      bVar3 = true;
    }
    else {
      unaff_BPL = 0;
LAB_003f81a8:
      bVar3 = false;
    }
    if (!bVar3) goto LAB_003f81fc;
    bVar3 = SepBy1BasicType<tinyusdz::Path>(this,',',']',result);
    if ((bVar3) && (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
      unaff_BPL = Expect(this,']');
      goto LAB_003f81fc;
    }
  }
  unaff_BPL = 0;
LAB_003f81fc:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Path> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }

  return true;
}